

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_synth.cpp
# Opt level: O0

void __thiscall Group::update_labels(Group *this)

{
  string *new_text;
  long in_RDI;
  float phase;
  float frequency;
  char buf [32];
  string *in_stack_ffffffffffffff38;
  Label *in_stack_ffffffffffffff40;
  Label *this_00;
  allocator<char> *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  allocator<char> local_51;
  string local_50 [32];
  float local_30;
  float local_2c;
  
  local_2c = get_frequency((Group *)0x10b631);
  local_30 = get_phase((Group *)0x10b644);
  sprintf(&stack0xffffffffffffffd8,"%4.0f Hz",(double)local_2c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  Label::set_text(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  this_00 = (Label *)&stack0xffffffffffffffd8;
  sprintf((char *)this_00,anon_var_dwarf_183,(double)local_30 / 3.141592653589793);
  new_text = (string *)(in_RDI + 0x1f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  Label::set_text(this_00,new_text);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff77);
  return;
}

Assistant:

void Group::update_labels()
{
   char buf[32];
   float frequency = get_frequency();
   float phase = get_phase();

   sprintf(buf, "%4.0f Hz", frequency);
   freq_val_label.set_text(buf);

   sprintf(buf, "%.2f π", phase/PI);
   phase_val_label.set_text(buf);
}